

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x64.c
# Opt level: O0

void asm_calculate_live_ranges(Trace *trace,IrRef *live_ranges)

{
  IrIns ins_00;
  uint16_t uVar1;
  IrRef IVar2;
  IrRef IVar3;
  IrRef arg2;
  IrRef arg1;
  IrIns ins;
  IrRef i;
  IrRef *live_ranges_local;
  Trace *trace_local;
  
  ins._6_2_ = (ushort)trace->ir_count;
  while (ins._6_2_ = ins._6_2_ - 1, ins._6_2_ != 0) {
    ins_00 = trace->ir[ins._6_2_];
    uVar1 = ir_op_prefix(ins_00);
    if (uVar1 != 0) {
      IVar2 = ir_arg1(ins_00);
      IVar3 = ir_arg2(ins_00);
      if (live_ranges[IVar2] == 0) {
        live_ranges[IVar2] = ins._6_2_;
      }
      if (live_ranges[IVar3] == 0) {
        live_ranges[IVar3] = ins._6_2_;
      }
    }
  }
  return;
}

Assistant:

static void asm_calculate_live_ranges(Trace *trace, IrRef *live_ranges) {
	// Iterate over all instructions in reverse order. The last instruction to
	// use a variable defines its live range (a property of SSA form).
	for (IrRef i = trace->ir_count - 1; i >= 1; i--) {
		IrIns ins = trace->ir[i];

		// Depending on if the instruction has a reference to another 
		// instruction, which we can determine from its opcode prefix
		if (ir_op_prefix(ins) == IROP_PREFIX_LOAD) {
			// No reference to any other instructions
		} else {
			// Two references to other instructions
			IrRef arg1 = ir_arg1(ins);
			IrRef arg2 = ir_arg2(ins);

			// If the live range of one of these arguments has already been set,
			// then it was used in a later instruction (since we're iterating
			// in reverse order). So only update the argument's live range if
			// it hasn't already been set
			if (live_ranges[arg1] == IR_NONE) {
				live_ranges[arg1] = i;
			}
			if (live_ranges[arg2] == IR_NONE) {
				live_ranges[arg2] = i;
			}
		}
	}
}